

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pdfa.c
# Opt level: O3

HPDF_STATUS HPDF_PDFA_AppendOutputIntents(HPDF_Doc pdf,char *iccname,HPDF_Dict iccdict)

{
  HPDF_BOOL HVar1;
  HPDF_Dict dict;
  HPDF_STATUS HVar2;
  HPDF_STATUS HVar3;
  HPDF_STATUS HVar4;
  HPDF_String p_Var5;
  HPDF_STATUS HVar6;
  HPDF_STATUS HVar7;
  HPDF_STATUS HVar8;
  HPDF_Array array;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 == 0) {
    HVar2 = 0x1025;
  }
  else {
    dict = HPDF_Dict_New(pdf->mmgr);
    HVar2 = HPDF_Xref_Add(pdf->xref,dict);
    if (HVar2 == 0) {
      HVar3 = HPDF_Dict_AddName(dict,"Type","OutputIntent");
      HVar4 = HPDF_Dict_AddName(dict,"S","GTS_PDFA1");
      p_Var5 = HPDF_String_New(pdf->mmgr,iccname,(HPDF_Encoder_conflict)0x0);
      HVar6 = HPDF_Dict_Add(dict,"OutputConditionIdentifier",p_Var5);
      p_Var5 = HPDF_String_New(pdf->mmgr,iccname,(HPDF_Encoder_conflict)0x0);
      HVar7 = HPDF_Dict_Add(dict,"OutputCondition",p_Var5);
      p_Var5 = HPDF_String_New(pdf->mmgr,iccname,(HPDF_Encoder_conflict)0x0);
      HVar8 = HPDF_Dict_Add(dict,"Info",p_Var5);
      HVar2 = HPDF_Dict_Add(dict,"DestOutputProfile ",iccdict);
      HVar2 = HVar2 + HVar8 + HVar7 + HVar6 + HVar4 + HVar3;
      if (HVar2 == 0) {
        array = (HPDF_Array)HPDF_Dict_GetItem(pdf->catalog,"OutputIntents",0x10);
        if (array == (HPDF_Array)0x0) {
          array = HPDF_Array_New(pdf->mmgr);
          if (array == (HPDF_Array)0x0) {
            array = (HPDF_Array)0x0;
          }
          else {
            HVar2 = HPDF_Dict_Add(pdf->catalog,"OutputIntents",array);
            if (HVar2 != 0) {
              HPDF_CheckError(&pdf->error);
              goto LAB_00136433;
            }
          }
        }
        HPDF_Array_Add(array,dict);
LAB_00136433:
        HVar2 = HPDF_Error_GetDetailCode(&pdf->error);
        return HVar2;
      }
    }
    HPDF_Dict_Free(dict);
  }
  return HVar2;
}

Assistant:

HPDF_STATUS
HPDF_PDFA_AppendOutputIntents(HPDF_Doc pdf, const char *iccname, HPDF_Dict iccdict)
{
    HPDF_Array intents;
    HPDF_Dict intent;
    HPDF_STATUS ret;
    if (!HPDF_HasDoc (pdf))
        return HPDF_INVALID_DOCUMENT;

    /* prepare intent */
    intent = HPDF_Dict_New (pdf->mmgr);
    ret = HPDF_Xref_Add (pdf->xref, intent);
    if ( ret != HPDF_OK) {
        HPDF_Dict_Free(intent);
        return ret;
    }
    ret += HPDF_Dict_AddName (intent, "Type", "OutputIntent");
    ret += HPDF_Dict_AddName (intent, "S", "GTS_PDFA1");
    ret += HPDF_Dict_Add (intent, "OutputConditionIdentifier", HPDF_String_New (pdf->mmgr, iccname, NULL));
    ret += HPDF_Dict_Add (intent, "OutputCondition", HPDF_String_New (pdf->mmgr, iccname,NULL));
    ret += HPDF_Dict_Add (intent, "Info", HPDF_String_New (pdf->mmgr, iccname, NULL));
    ret += HPDF_Dict_Add (intent, "DestOutputProfile ", iccdict);
    if ( ret != HPDF_OK) {
        HPDF_Dict_Free(intent);
        return ret;
    }

    /* Copied from HPDF_AddIntent - not public function */
    intents = HPDF_Dict_GetItem (pdf->catalog, "OutputIntents", HPDF_OCLASS_ARRAY);
    if (intents == NULL) {
        intents = HPDF_Array_New (pdf->mmgr);
        if (intents) {
            ret = HPDF_Dict_Add (pdf->catalog, "OutputIntents", intents);
            if (ret != HPDF_OK) {
                HPDF_CheckError (&pdf->error);
                return HPDF_Error_GetDetailCode (&pdf->error);
            }
        }
    }

    HPDF_Array_Add(intents,intent);
    return HPDF_Error_GetDetailCode (&pdf->error);
}